

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshvolume.cpp
# Opt level: O1

float computeMeshVolume2(float *vertices,uint tcount,uint *indices)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  
  if (tcount != 0) {
    fVar1 = *vertices;
    fVar2 = vertices[1];
    fVar3 = vertices[2];
    fVar8 = 0.0;
    do {
      uVar5 = (ulong)(*indices * 3);
      uVar6 = (ulong)(indices[1] * 3);
      uVar7 = (ulong)(indices[2] * 3);
      auVar4 = vfmsub231ss_fma(ZEXT416((uint)((vertices[uVar7 + 1] - fVar2) *
                                             (vertices[uVar6 + 2] - fVar3))),
                               ZEXT416((uint)(vertices[uVar6 + 1] - fVar2)),
                               ZEXT416((uint)(vertices[uVar7 + 2] - fVar3)));
      auVar9 = vfmsub231ss_fma(ZEXT416((uint)((vertices[uVar7 + 2] - fVar3) *
                                             (vertices[uVar6] - fVar1))),
                               ZEXT416((uint)(vertices[uVar7] - fVar1)),
                               ZEXT416((uint)(vertices[uVar6 + 2] - fVar3)));
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * (vertices[uVar5 + 1] - fVar2))),
                               ZEXT416((uint)(vertices[uVar5] - fVar1)),auVar4);
      auVar9 = vfmsub231ss_fma(ZEXT416((uint)((vertices[uVar7] - fVar1) *
                                             (vertices[uVar6 + 1] - fVar2))),
                               ZEXT416((uint)(vertices[uVar6] - fVar1)),
                               ZEXT416((uint)(vertices[uVar7 + 1] - fVar2)));
      auVar4 = vfmadd213ss_fma(auVar9,ZEXT416((uint)(vertices[uVar5 + 2] - fVar3)),auVar4);
      auVar9._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
      auVar9._8_4_ = auVar4._8_4_ ^ 0x80000000;
      auVar9._12_4_ = auVar4._12_4_ ^ 0x80000000;
      auVar4 = vmaxss_avx(auVar9,auVar4);
      fVar8 = fVar8 + auVar4._0_4_;
      indices = indices + 3;
      tcount = tcount - 1;
    } while (tcount != 0);
    return fVar8 * 0.16666667;
  }
  return 0.0;
}

Assistant:

float computeMeshVolume2(const float *vertices,unsigned int tcount,const unsigned int *indices)
{
	float volume = 0;

	const float *p0 = vertices;
	for (unsigned int i=0; i<tcount; i++,indices+=3)
	{

		const float *p1 = &vertices[ indices[0]*3 ];
		const float *p2 = &vertices[ indices[1]*3 ];
		const float *p3 = &vertices[ indices[2]*3 ];

		volume+=tetVolume(p0,p1,p2,p3); // compute the volume of the tetrahedron relative to the root vertice
	}

  return volume * (1.0f / 6.0f );
}